

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

vec<Minisat::Solver::Watcher,_int> * __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::lookup(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
         *this,Lit *idx)

{
  char *pcVar1;
  vec<Minisat::Solver::Watcher,_int> *pvVar2;
  
  pcVar1 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[](&this->dirty,(Lit)idx->x);
  if (*pcVar1 != '\0') {
    clean(this,idx);
  }
  pvVar2 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>::
           operator[](&this->occs,(Lit)idx->x);
  return pvVar2;
}

Assistant:

Vec&  lookup    (const K& idx){ if (dirty[idx]) clean(idx); return occs[idx]; }